

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2shape_index.h
# Opt level: O0

void __thiscall EncodedS2ShapeIndex::Iterator::Next(Iterator *this)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  Iterator *local_10;
  Iterator *this_local;
  
  local_10 = this;
  bVar1 = S2ShapeIndex::IteratorBase::done(&this->super_IteratorBase);
  if (!bVar1) {
    this->cell_pos_ = this->cell_pos_ + 1;
    Refresh(this);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2shape_index.h"
             ,0xdc,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: !done() ");
  S2LogMessageVoidify::operator&(&local_11,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

inline void EncodedS2ShapeIndex::Iterator::Next() {
  S2_DCHECK(!done());
  ++cell_pos_;
  Refresh();
}